

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ProcessClientTrackedObjects(Recycler *this)

{
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  size_t *psVar2;
  Type pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *ppvVar7;
  void *parentReference;
  Type buffer;
  undefined1 local_40 [8];
  Iterator iter;
  
  if (this->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1088,"(this->inPartialCollectMode)","this->inPartialCollectMode");
    if (!bVar5) goto LAB_00718e2c;
    *puVar6 = 0;
  }
  bVar5 = DoQueueTrackedObject(this);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x108a,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar5) {
LAB_00718e2c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pSVar1 = &this->clientTrackedObjectList;
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) {
    local_40 = (undefined1  [8])pSVar1;
    iter.list = pSVar1;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (iter.list == (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_00718e2c;
        *puVar6 = 0;
      }
      iter.list = (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])iter.list == local_40) break;
      ppvVar7 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      TryMarkNonInterior(this,*ppvVar7,parentReference);
      psVar2 = &(this->collectionStats).clientTrackedObjectCount;
      *psVar2 = *psVar2 + 1;
    }
    buffer = (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next;
    if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)buffer != pSVar1) {
      iter.list = (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      do {
        pSVar3 = buffer->next;
        ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&(this->clientTrackedObjectAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,
                   0x10);
        buffer = pSVar3;
      } while ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)pSVar3 != pSVar1);
    }
    (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next =
         &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
    (this->clientTrackedObjectList).super_RealCount.count = 0;
  }
  return;
}

Assistant:

void
Recycler::ProcessClientTrackedObjects()
{
    GCETW(GC_PROCESS_CLIENT_TRACKED_OBJECT_START, (this));

    Assert(this->inPartialCollectMode);
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif

    if (!this->clientTrackedObjectList.Empty())
    {
        SListBase<void *>::Iterator iter(&this->clientTrackedObjectList);
        while (iter.Next())
        {
            auto& reference = iter.Data();
            this->TryMarkNonInterior(reference, &reference /* parentReference */);  // Reference to inside the node
            RECYCLER_STATS_INC(this, clientTrackedObjectCount);
        }

        this->clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
    }

    GCETW(GC_PROCESS_CLIENT_TRACKED_OBJECT_STOP, (this));
}